

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

ON_PointCloud *
ON_PointCloud::RandomSubsample
          (ON_PointCloud *source_point_cloud,uint subsample_point_count,
          ON_PointCloud *destination_point_cloud,ON_ProgressReporter *progress_reporter,
          ON_Terminator *terminator)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON__UINT32 OVar5;
  bool *pbVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint local_a28;
  uint i_1;
  int point_index;
  uint i;
  uint last_point_count;
  ON_RandomNumberGenerator gen;
  bool bAlloc;
  bool bHaveHidden;
  bool bHaveValues;
  bool bHaveColors;
  bool bHaveNormals;
  uint points_to_remove;
  uint point_count;
  ON_Terminator *terminator_local;
  ON_ProgressReporter *progress_reporter_local;
  ON_PointCloud *destination_point_cloud_local;
  uint subsample_point_count_local;
  ON_PointCloud *source_point_cloud_local;
  
  if (((source_point_cloud == (ON_PointCloud *)0x0) || (subsample_point_count == 0)) ||
     (uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                        (&(source_point_cloud->m_P).super_ON_SimpleArray<ON_3dPoint>),
     uVar3 <= subsample_point_count)) {
    source_point_cloud_local = (ON_PointCloud *)0x0;
  }
  else {
    point_index = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                            (&(source_point_cloud->m_P).super_ON_SimpleArray<ON_3dPoint>);
    uVar3 = point_index - subsample_point_count;
    if (uVar3 == 0) {
      source_point_cloud_local = (ON_PointCloud *)0x0;
    }
    else {
      uVar4 = ON_SimpleArray<ON_3dVector>::UnsignedCount(&source_point_cloud->m_N);
      bVar7 = point_index == uVar4;
      uVar4 = ON_SimpleArray<ON_Color>::UnsignedCount(&source_point_cloud->m_C);
      bVar8 = point_index == uVar4;
      uVar4 = ON_SimpleArray<double>::UnsignedCount(&source_point_cloud->m_V);
      bVar9 = point_index == uVar4;
      uVar4 = ON_SimpleArray<bool>::UnsignedCount(&source_point_cloud->m_H);
      bVar10 = point_index == uVar4;
      bVar1 = false;
      if (destination_point_cloud == (ON_PointCloud *)0x0) {
        progress_reporter_local = (ON_ProgressReporter *)operator_new(0x148);
        ON_PointCloud((ON_PointCloud *)progress_reporter_local,source_point_cloud);
        bVar1 = true;
      }
      else {
        progress_reporter_local = (ON_ProgressReporter *)destination_point_cloud;
        if (source_point_cloud != destination_point_cloud) {
          Destroy(destination_point_cloud);
          operator=(destination_point_cloud,source_point_cloud);
        }
      }
      ON_RandomNumberGenerator::ON_RandomNumberGenerator((ON_RandomNumberGenerator *)&i);
      ON_RandomNumberGenerator::Seed((ON_RandomNumberGenerator *)&i);
      for (i_1 = 0; i_1 < uVar3; i_1 = i_1 + 1) {
        if ((terminator != (ON_Terminator *)0x0) &&
           (bVar2 = ON_Terminator::TerminationRequested(terminator), bVar2)) {
          if (source_point_cloud != (ON_PointCloud *)progress_reporter_local) {
            Destroy((ON_PointCloud *)progress_reporter_local);
          }
          if ((bVar1) && (progress_reporter_local != (ON_ProgressReporter *)0x0)) {
            (**(code **)(progress_reporter_local->m_callback_function + 0x20))();
          }
          return (ON_PointCloud *)0x0;
        }
        if (progress_reporter != (ON_ProgressReporter *)0x0) {
          ON_ProgressReporter::ReportProgress(progress_reporter,(double)i_1 / (double)uVar3);
        }
        OVar5 = ON_RandomNumberGenerator::RandomNumber((ON_RandomNumberGenerator *)&i);
        uVar4 = OVar5 % (uint)point_index;
        ON_SimpleArray<ON_3dPoint>::Swap
                  ((ON_SimpleArray<ON_3dPoint> *)&progress_reporter_local->m_fraction_complete,uVar4
                   ,point_index + -1);
        if (bVar7) {
          ON_SimpleArray<ON_3dVector>::Swap
                    ((ON_SimpleArray<ON_3dVector> *)(progress_reporter_local->m_reserved + 1),uVar4,
                     point_index + -1);
        }
        if (bVar8) {
          ON_SimpleArray<ON_Color>::Swap
                    ((ON_SimpleArray<ON_Color> *)(progress_reporter_local + 1),uVar4,
                     point_index + -1);
        }
        if (bVar9) {
          ON_SimpleArray<double>::Swap
                    ((ON_SimpleArray<double> *)
                     &progress_reporter_local[1].m_previous_callback_fraction_complete,uVar4,
                     point_index + -1);
        }
        if (bVar10) {
          ON_SimpleArray<bool>::Swap
                    ((ON_SimpleArray<bool> *)(progress_reporter_local[1].m_reserved + 2),uVar4,
                     point_index + -1);
        }
        point_index = point_index + -1;
        if (point_index == 0) break;
      }
      if (progress_reporter != (ON_ProgressReporter *)0x0) {
        ON_ProgressReporter::ReportProgress(progress_reporter,1.0);
      }
      ON_SimpleArray<ON_3dPoint>::SetCount
                ((ON_SimpleArray<ON_3dPoint> *)&progress_reporter_local->m_fraction_complete,
                 subsample_point_count);
      ON_SimpleArray<ON_3dPoint>::Shrink
                ((ON_SimpleArray<ON_3dPoint> *)&progress_reporter_local->m_fraction_complete);
      if (bVar7) {
        ON_SimpleArray<ON_3dVector>::SetCount
                  ((ON_SimpleArray<ON_3dVector> *)(progress_reporter_local->m_reserved + 1),
                   subsample_point_count);
        ON_SimpleArray<ON_3dVector>::Shrink
                  ((ON_SimpleArray<ON_3dVector> *)(progress_reporter_local->m_reserved + 1));
      }
      if (bVar8) {
        ON_SimpleArray<ON_Color>::SetCount
                  ((ON_SimpleArray<ON_Color> *)(progress_reporter_local + 1),subsample_point_count);
        ON_SimpleArray<ON_Color>::Shrink((ON_SimpleArray<ON_Color> *)(progress_reporter_local + 1));
      }
      if (bVar9) {
        ON_SimpleArray<double>::SetCount
                  ((ON_SimpleArray<double> *)
                   &progress_reporter_local[1].m_previous_callback_fraction_complete,
                   subsample_point_count);
        ON_SimpleArray<double>::Shrink
                  ((ON_SimpleArray<double> *)
                   &progress_reporter_local[1].m_previous_callback_fraction_complete);
      }
      if (bVar10) {
        ON_SimpleArray<bool>::SetCount
                  ((ON_SimpleArray<bool> *)(progress_reporter_local[1].m_reserved + 2),
                   subsample_point_count);
        ON_SimpleArray<bool>::Shrink
                  ((ON_SimpleArray<bool> *)(progress_reporter_local[1].m_reserved + 2));
        *(undefined4 *)&progress_reporter_local[2].m_callback_context = 0;
        for (local_a28 = 0;
            uVar3 = ON_SimpleArray<bool>::UnsignedCount
                              ((ON_SimpleArray<bool> *)(progress_reporter_local[1].m_reserved + 2)),
            local_a28 < uVar3; local_a28 = local_a28 + 1) {
          pbVar6 = ON_SimpleArray<bool>::operator[]
                             ((ON_SimpleArray<bool> *)(progress_reporter_local[1].m_reserved + 2),
                              local_a28);
          if ((*pbVar6 & 1U) != 0) {
            *(int *)&progress_reporter_local[2].m_callback_context =
                 (int)progress_reporter_local[2].m_callback_context + 1;
          }
        }
      }
      source_point_cloud_local = (ON_PointCloud *)progress_reporter_local;
    }
  }
  return source_point_cloud_local;
}

Assistant:

ON_PointCloud* ON_PointCloud::RandomSubsample(
  const ON_PointCloud* source_point_cloud,
  const unsigned int subsample_point_count,
  ON_PointCloud* destination_point_cloud,
  ON_ProgressReporter* progress_reporter,
  ON_Terminator* terminator
)
{
  if (
       nullptr == source_point_cloud 
    || subsample_point_count <= 0 
    || subsample_point_count >= source_point_cloud->m_P.UnsignedCount()
    )
    return nullptr;

  const unsigned int point_count = source_point_cloud->m_P.UnsignedCount();
  const unsigned int points_to_remove = point_count - subsample_point_count;
  if (points_to_remove <= 0)
    return nullptr;

  const bool bHaveNormals = point_count == source_point_cloud->m_N.UnsignedCount();
  const bool bHaveColors = point_count == source_point_cloud->m_C.UnsignedCount();
  const bool bHaveValues = point_count == source_point_cloud->m_V.UnsignedCount();
  const bool bHaveHidden = point_count == source_point_cloud->m_H.UnsignedCount();

  bool bAlloc = false;
  if (destination_point_cloud)
  {
    if (source_point_cloud != destination_point_cloud)
    {
      destination_point_cloud->Destroy();
      *destination_point_cloud = *source_point_cloud;
    }
  }
  else
  {
    destination_point_cloud = new ON_PointCloud(*source_point_cloud);
    bAlloc = true;
  }

  ON_RandomNumberGenerator gen;
  gen.Seed();

  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < points_to_remove; i++)
  {
    if (terminator && ON_Terminator::TerminationRequested(terminator))
    {
      if (source_point_cloud != destination_point_cloud)
        destination_point_cloud->Destroy();
      if (bAlloc)
        delete destination_point_cloud;
      return nullptr;
    }

    if (progress_reporter)
      ON_ProgressReporter::ReportProgress(progress_reporter, i / (double)points_to_remove);

    // For (min <= r < max): min + RandomNumber() % (max-min)
    const int point_index = gen.RandomNumber() % last_point_count;

    destination_point_cloud->m_P.Swap(point_index, last_point_count - 1);
    if (bHaveNormals)
      destination_point_cloud->m_N.Swap(point_index, last_point_count - 1);
    if (bHaveColors)
      destination_point_cloud->m_C.Swap(point_index, last_point_count - 1);
    if (bHaveValues)
      destination_point_cloud->m_V.Swap(point_index, last_point_count - 1);
    if (bHaveHidden)
      destination_point_cloud->m_H.Swap(point_index, last_point_count - 1);

    last_point_count--;
    if (last_point_count <= 0)
      break;
  }

  if (progress_reporter)
    ON_ProgressReporter::ReportProgress(progress_reporter, 1.0);

  destination_point_cloud->m_P.SetCount(subsample_point_count);
  destination_point_cloud->m_P.Shrink();
  if (bHaveNormals)
  {
    destination_point_cloud->m_N.SetCount(subsample_point_count);
    destination_point_cloud->m_N.Shrink();
  }
  if (bHaveColors)
  {
    destination_point_cloud->m_C.SetCount(subsample_point_count);
    destination_point_cloud->m_C.Shrink();
  }
  if (bHaveValues)
  {
    destination_point_cloud->m_V.SetCount(subsample_point_count);
    destination_point_cloud->m_V.Shrink();
  }
  if (bHaveHidden)
  {
    destination_point_cloud->m_H.SetCount(subsample_point_count);
    destination_point_cloud->m_H.Shrink();
    destination_point_cloud->m_hidden_count = 0;
    for (unsigned int i = 0; i < destination_point_cloud->m_H.UnsignedCount(); i++)
    {
      if (destination_point_cloud->m_H[i])
        destination_point_cloud->m_hidden_count++;
    }
  }

  return destination_point_cloud;
}